

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutTruth.c
# Opt level: O2

void Cut_TruthComputeOld(Cut_Cut_t *pCut,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1,int fCompl0,int fCompl1)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  bVar1 = pCut->field_0x3 & 0xf;
  uVar5 = (ulong)(uint)(1 << (bVar1 - 5 & 0x1f));
  if (bVar1 < 6) {
    uVar5 = 1;
  }
  uVar2 = Cut_TruthPhase(pCut,pCut0);
  Extra_TruthExpand((byte)pCut->field_0x3 & 0xf,(int)uVar5,
                    (uint *)(&pCut0[1].field_0x0 + (ulong)((byte)pCut0->field_0x3 & 0xf) * 4),uVar2,
                    Cut_TruthComputeOld::uTruth0);
  if (fCompl0 != 0) {
    for (lVar4 = 0; uVar5 * 4 - lVar4 != 0; lVar4 = lVar4 + 4) {
      *(uint *)((long)Cut_TruthComputeOld::uTruth0 + lVar4) =
           ~*(uint *)((long)Cut_TruthComputeOld::uTruth0 + lVar4);
    }
  }
  uVar2 = Cut_TruthPhase(pCut,pCut1);
  Extra_TruthExpand((byte)pCut->field_0x3 & 0xf,(int)uVar5,
                    (uint *)(&pCut1[1].field_0x0 + (ulong)((byte)pCut1->field_0x3 & 0xf) * 4),uVar2,
                    Cut_TruthComputeOld::uTruth1);
  if (fCompl1 != 0) {
    for (lVar4 = 0; uVar5 * 4 - lVar4 != 0; lVar4 = lVar4 + 4) {
      *(uint *)((long)Cut_TruthComputeOld::uTruth1 + lVar4) =
           ~*(uint *)((long)Cut_TruthComputeOld::uTruth1 + lVar4);
    }
  }
  uVar3 = (ulong)(*(uint *)pCut >> 0x16 & 0x3c);
  if ((*(uint *)pCut >> 0x17 & 1) == 0) {
    for (lVar4 = 0; uVar5 << 2 != lVar4; lVar4 = lVar4 + 4) {
      *(uint *)(&pCut[1].field_0x0 + lVar4 + uVar3) =
           *(uint *)((long)Cut_TruthComputeOld::uTruth1 + lVar4) &
           *(uint *)((long)Cut_TruthComputeOld::uTruth0 + lVar4);
    }
  }
  else {
    for (lVar4 = 0; uVar5 << 2 != lVar4; lVar4 = lVar4 + 4) {
      *(uint *)(&pCut[1].field_0x0 + lVar4 + uVar3) =
           ~(*(uint *)((long)Cut_TruthComputeOld::uTruth1 + lVar4) &
            *(uint *)((long)Cut_TruthComputeOld::uTruth0 + lVar4));
    }
  }
  return;
}

Assistant:

void Cut_TruthComputeOld( Cut_Cut_t * pCut, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    static unsigned uTruth0[8], uTruth1[8];
    int nTruthWords = Cut_TruthWords( pCut->nVarsMax );
    unsigned * pTruthRes;
    int i, uPhase;

    // permute the first table
    uPhase = Cut_TruthPhase( pCut, pCut0 );
    Extra_TruthExpand( pCut->nVarsMax, nTruthWords, Cut_CutReadTruth(pCut0), uPhase, uTruth0 );
    if ( fCompl0 ) 
    {
        for ( i = 0; i < nTruthWords; i++ )
            uTruth0[i] = ~uTruth0[i];
    }

    // permute the second table
    uPhase = Cut_TruthPhase( pCut, pCut1 );
    Extra_TruthExpand( pCut->nVarsMax, nTruthWords, Cut_CutReadTruth(pCut1), uPhase, uTruth1 );
    if ( fCompl1 ) 
    {
        for ( i = 0; i < nTruthWords; i++ )
            uTruth1[i] = ~uTruth1[i];
    }

    // write the resulting table
    pTruthRes = Cut_CutReadTruth(pCut);

    if ( pCut->fCompl )
    {
        for ( i = 0; i < nTruthWords; i++ )
            pTruthRes[i] = ~(uTruth0[i] & uTruth1[i]);
    }
    else
    {
        for ( i = 0; i < nTruthWords; i++ )
            pTruthRes[i] = uTruth0[i] & uTruth1[i];
    }
}